

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O3

longlong __thiscall SchemePair::list_length(SchemePair *this)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  SchemePair *pSVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  longlong ans;
  longlong lVar8;
  initializer_list<const_SchemePair_*> __l;
  SchemePair *p;
  set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
  visited;
  allocator_type local_72;
  less<const_SchemePair_*> local_71;
  SchemePair *local_70;
  SchemePair *local_68;
  _Rb_tree<const_SchemePair_*,_const_SchemePair_*,_std::_Identity<const_SchemePair_*>,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
  local_60;
  
  __l._M_len = 1;
  __l._M_array = &local_68;
  local_70 = this;
  local_68 = this;
  std::set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>::
  set((set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_> *
      )&local_60,__l,&local_71,&local_72);
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  lVar8 = 0;
  do {
    if (this == (SchemePair *)
                scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    goto LAB_00126f78;
    peVar2 = (this->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      pSVar3 = (SchemePair *)0x0;
    }
    else {
      local_70 = (SchemePair *)__dynamic_cast(peVar2,&SchemeObject::typeinfo,&typeinfo,0);
      pSVar3 = (SchemePair *)0x0;
      if ((local_70 != (SchemePair *)0x0) &&
         (this_00 = (this->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi, pSVar3 = local_70,
         this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        pSVar3 = local_70;
      }
    }
    local_70 = pSVar3;
    p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var7 = &p_Var1->_M_header;
    if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      do {
        p_Var6 = p_Var7;
        p_Var5 = p_Var4;
        pSVar3 = *(SchemePair **)(p_Var5 + 1);
        p_Var7 = p_Var5;
        if (pSVar3 < local_70) {
          p_Var7 = p_Var6;
        }
        p_Var4 = (&p_Var5->_M_left)[pSVar3 < local_70];
      } while ((&p_Var5->_M_left)[pSVar3 < local_70] != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var7 != p_Var1) {
        if (pSVar3 < local_70) {
          p_Var5 = p_Var6;
        }
        if (*(SchemePair **)(p_Var5 + 1) <= local_70) {
          lVar8 = -2;
          goto LAB_00126f78;
        }
      }
    }
    std::
    _Rb_tree<SchemePair_const*,SchemePair_const*,std::_Identity<SchemePair_const*>,std::less<SchemePair_const*>,std::allocator<SchemePair_const*>>
    ::_M_insert_unique<SchemePair_const*const&>
              ((_Rb_tree<SchemePair_const*,SchemePair_const*,std::_Identity<SchemePair_const*>,std::less<SchemePair_const*>,std::allocator<SchemePair_const*>>
                *)&local_60,&local_70);
    lVar8 = lVar8 + 1;
    this = local_70;
  } while (local_70 != (SchemePair *)0x0);
  lVar8 = -1;
LAB_00126f78:
  std::
  _Rb_tree<const_SchemePair_*,_const_SchemePair_*,_std::_Identity<const_SchemePair_*>,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
  ::~_Rb_tree(&local_60);
  return lVar8;
}

Assistant:

long long SchemePair::list_length() const
{
    const SchemePair *p = this;
    std::set<const SchemePair*> visited{p};
    for(long long ans=0;;++ans)
    {
        if(!p)
            return -1;
        if(p == scheme_nil.get())
            return ans;
        p = std::dynamic_pointer_cast<SchemePair>(p->cdr).get();
        if(visited.count(p))
            return -2;
        visited.insert(p);
    }
}